

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O1

string * __thiscall
Bipartition::toString_abi_cxx11_(string *__return_storage_ptr__,Bipartition *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  boost::to_string_helper<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
            (&this->partition,__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

string Bipartition::toString() {
    string s;
    to_string(partition, s);
    return s;
}